

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpOps.cpp
# Opt level: O0

sz_sock sznet::net::sockets::sz_udp_create(int family)

{
  LogStream *this;
  SourceFile file;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  int local_10;
  int local_c;
  sz_sock sockfd;
  int family_local;
  
  local_c = family;
  local_10 = socket(family,2,0x11);
  if (local_10 < 0) {
    Logger::SourceFile::SourceFile<97>
              ((SourceFile *)local_ff0,
               (char (*) [97])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/UdpOps.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    Logger::Logger(&local_fe0,file,0x13,true);
    this = Logger::stream(&local_fe0);
    LogStream::operator<<(this,"sockets::sz_udp_create");
    Logger::~Logger(&local_fe0);
  }
  return local_10;
}

Assistant:

sz_sock sz_udp_create(int family)
{
	sz_sock sockfd = ::socket(family, SOCK_DGRAM, IPPROTO_UDP);
	if (sockfd < 0)
	{
		LOG_SYSFATAL << "sockets::sz_udp_create";
	}

	return sockfd;
}